

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssembly.cpp
# Opt level: O3

Var Js::WebAssembly::EntryValidate(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var source;
  int in_stack_00000010;
  undefined1 local_50 [8];
  WebAssemblySource src;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0xb5,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d87037;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  src.sourceInfo = (Utf8SourceInfo *)callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&src.sourceInfo,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)src.sourceInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0xb6,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) goto LAB_00d87037;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0xb9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d87037:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)src.sourceInfo & 0xfffffe) != 0) {
    source = Arguments::operator[]((Arguments *)&src.sourceInfo,1);
    WebAssemblySource::WebAssemblySource((WebAssemblySource *)local_50,source,false,pSVar1);
    bVar3 = WebAssemblyModule::ValidateModule(pSVar1,(WebAssemblySource *)local_50);
    return (&(((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             booleanTrue)[!bVar3].ptr;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e4a6,(PCWSTR)0x0);
}

Assistant:

Var WebAssembly::EntryValidate(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2)
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }

    WebAssemblySource src(args[1], false, scriptContext);
    if (WebAssemblyModule::ValidateModule(scriptContext, &src))
    {
        return scriptContext->GetLibrary()->GetTrue();
    }
    else
    {
        return scriptContext->GetLibrary()->GetFalse();
    }
}